

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

BOOL __thiscall GlobOptBlockData::IsArgumentsOpnd(GlobOptBlockData *this,Opnd *opnd)

{
  Sym *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  RegOpnd *pRVar4;
  StackSym *pSVar5;
  SymOpnd *pSVar6;
  PropertySym *pPVar7;
  IndirOpnd *pIVar8;
  undefined4 *puVar9;
  
  bVar2 = IR::Opnd::IsRegOpnd(opnd);
  if (bVar2) {
    pRVar4 = IR::Opnd::AsRegOpnd(opnd);
    pSVar5 = pRVar4->m_sym;
  }
  else {
    bVar2 = IR::Opnd::IsSymOpnd(opnd);
    if (!bVar2) {
      bVar2 = IR::Opnd::IsIndirOpnd(opnd);
      if (bVar2) {
        pIVar8 = IR::Opnd::AsIndirOpnd(opnd);
        pRVar4 = pIVar8->m_indexOpnd;
        pIVar8 = IR::Opnd::AsIndirOpnd(opnd);
        BVar3 = IsArgumentsSymID(this,(pIVar8->m_baseOpnd->m_sym->super_Sym).m_id);
        if (BVar3 != 0) {
          return 1;
        }
        if (pRVar4 != (RegOpnd *)0x0) {
          BVar3 = IsArgumentsSymID(this,(pRVar4->m_sym->super_Sym).m_id);
          return (uint)(BVar3 != 0);
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar9 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                           ,0x501,"(false)","Unknown type");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar9 = 0;
      }
      return 0;
    }
    pSVar6 = IR::Opnd::AsSymOpnd(opnd);
    this_00 = pSVar6->m_sym;
    if (this_00 == (Sym *)0x0) {
      return 0;
    }
    if (this_00->m_kind != SymKindProperty) {
      return 0;
    }
    pPVar7 = Sym::AsPropertySym(this_00);
    pSVar5 = pPVar7->m_stackSym;
  }
  BVar3 = IsArgumentsSymID(this,(pSVar5->super_Sym).m_id);
  return BVar3;
}

Assistant:

BOOL
GlobOptBlockData::IsArgumentsOpnd(IR::Opnd const* opnd) const
{
    SymID id = 0;
    if (opnd->IsRegOpnd())
    {
        id = opnd->AsRegOpnd()->m_sym->m_id;
        return this->IsArgumentsSymID(id);
    }
    else if (opnd->IsSymOpnd())
    {
        Sym const *sym = opnd->AsSymOpnd()->m_sym;
        if (sym && sym->IsPropertySym())
        {
            PropertySym const *propertySym = sym->AsPropertySym();
            id = propertySym->m_stackSym->m_id;
            return this->IsArgumentsSymID(id);
        }
        return false;
    }
    else if (opnd->IsIndirOpnd())
    {
        IR::RegOpnd const *indexOpnd = opnd->AsIndirOpnd()->GetIndexOpnd();
        IR::RegOpnd const *baseOpnd = opnd->AsIndirOpnd()->GetBaseOpnd();
        return this->IsArgumentsSymID(baseOpnd->m_sym->m_id) || (indexOpnd && this->IsArgumentsSymID(indexOpnd->m_sym->m_id));
    }
    AssertMsg(false, "Unknown type");
    return false;
}